

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sq.cpp
# Opt level: O0

bool checkOption(char **argv,int argc,char *option,char **optArg)

{
  char *pcVar1;
  int iVar2;
  undefined8 *in_RCX;
  char *in_RDX;
  int in_ESI;
  long in_RDI;
  char *arg2;
  char *arg;
  int i;
  int local_2c;
  
  *in_RCX = 0;
  local_2c = 1;
  while( true ) {
    if (in_ESI <= local_2c) {
      return false;
    }
    pcVar1 = *(char **)(in_RDI + (long)local_2c * 8);
    if ((*pcVar1 == '-') && (iVar2 = strcmp(pcVar1 + 1,in_RDX), iVar2 == 0)) break;
    local_2c = local_2c + 1;
  }
  if ((local_2c + 1 < in_ESI) &&
     (pcVar1 = *(char **)(in_RDI + (long)(local_2c + 1) * 8), *pcVar1 != '-')) {
    *in_RCX = pcVar1;
  }
  return true;
}

Assistant:

static bool checkOption(char *argv[], int argc, const char *option, const char *&optArg) {
  optArg = nullptr;
  for (int i = 1; i< argc; ++i) {
    const char *arg = argv[i];

    if (arg[0] == '-' && strcmp(arg + 1, option) == 0) {
      if ((i + 1) < argc) {
        const char *arg2 = argv[i + 1];
        if (arg2[0] != '-') { // not next option
          optArg = arg2;
        }
      }
      return true;
    }
  }

  return false;
}